

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LinkedModelFile::LinkedModelFile(LinkedModelFile *this,LinkedModelFile *from)

{
  void *pvVar1;
  StringParameter *pSVar2;
  StringParameter *pSVar3;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LinkedModelFile_003c5c38;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pSVar2 = from->linkedmodelfilename_;
  if (pSVar2 == (StringParameter *)0x0 ||
      from == (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    pSVar3 = (StringParameter *)0x0;
  }
  else {
    pSVar3 = (StringParameter *)operator_new(0x20);
    StringParameter::StringParameter(pSVar3,pSVar2);
  }
  this->linkedmodelfilename_ = pSVar3;
  pSVar2 = from->linkedmodelsearchpath_;
  if (pSVar2 == (StringParameter *)0x0 ||
      from == (LinkedModelFile *)&_LinkedModelFile_default_instance_) {
    pSVar3 = (StringParameter *)0x0;
  }
  else {
    pSVar3 = (StringParameter *)operator_new(0x20);
    StringParameter::StringParameter(pSVar3,pSVar2);
  }
  this->linkedmodelsearchpath_ = pSVar3;
  return;
}

Assistant:

LinkedModelFile::LinkedModelFile(const LinkedModelFile& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_linkedmodelfilename()) {
    linkedmodelfilename_ = new ::CoreML::Specification::StringParameter(*from.linkedmodelfilename_);
  } else {
    linkedmodelfilename_ = NULL;
  }
  if (from.has_linkedmodelsearchpath()) {
    linkedmodelsearchpath_ = new ::CoreML::Specification::StringParameter(*from.linkedmodelsearchpath_);
  } else {
    linkedmodelsearchpath_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LinkedModelFile)
}